

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_convert_frames_ex
                    (void *pOut,ma_uint64 frameCountOut,void *pIn,ma_uint64 frameCountIn,
                    ma_data_converter_config *pConfig)

{
  ma_result mVar1;
  ma_data_converter converter;
  ma_uint64 local_2790;
  ma_uint64 local_2788;
  ma_data_converter local_2780;
  
  if ((pConfig == (ma_data_converter_config *)0x0 || frameCountIn == 0) ||
     (local_2790 = frameCountOut, local_2788 = frameCountIn,
     mVar1 = ma_data_converter_init(pConfig,&local_2780), mVar1 != 0)) {
    local_2788 = 0;
  }
  else if (pOut == (void *)0x0) {
    if (local_2780.hasResampler != '\0') {
      local_2788 = ma_resampler_get_expected_output_frame_count(&local_2780.resampler,local_2788);
    }
  }
  else {
    mVar1 = ma_data_converter_process_pcm_frames(&local_2780,pIn,&local_2788,pOut,&local_2790);
    local_2788 = local_2790;
    if (mVar1 != 0) {
      local_2790 = 0;
      local_2788 = local_2790;
    }
  }
  return local_2788;
}

Assistant:

MA_API ma_uint64 ma_convert_frames_ex(void* pOut, ma_uint64 frameCountOut, const void* pIn, ma_uint64 frameCountIn, const ma_data_converter_config* pConfig)
{
    ma_result result;
    ma_data_converter converter;

    if (frameCountIn == 0 || pConfig == NULL) {
        return 0;
    }

    result = ma_data_converter_init(pConfig, &converter);
    if (result != MA_SUCCESS) {
        return 0;   /* Failed to initialize the data converter. */
    }

    if (pOut == NULL) {
        frameCountOut = ma_data_converter_get_expected_output_frame_count(&converter, frameCountIn);
    } else {
        result = ma_data_converter_process_pcm_frames(&converter, pIn, &frameCountIn, pOut, &frameCountOut);
        if (result != MA_SUCCESS) {
            frameCountOut = 0;
        }
    }

    ma_data_converter_uninit(&converter);
    return frameCountOut;
}